

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3Close(sqlite3 *db,int forceZombie)

{
  Schema *pSVar1;
  VTable *pVTab;
  VTable **ppVVar2;
  int iVar3;
  VTable **ppVVar4;
  long lVar5;
  HashElem *pHVar6;
  
  if (db != (sqlite3 *)0x0) {
    iVar3 = sqlite3SafetyCheckSickOrOk(db);
    if (iVar3 == 0) {
      sqlite3MisuseError(0x1c396);
      return 0x15;
    }
    if (db->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
    }
    sqlite3BtreeEnterAll(db);
    for (lVar5 = 0; lVar5 < db->nDb; lVar5 = lVar5 + 1) {
      pSVar1 = db->aDb[lVar5].pSchema;
      if (pSVar1 != (Schema *)0x0) {
        pHVar6 = (HashElem *)&(pSVar1->tblHash).first;
LAB_0013e15e:
        pHVar6 = pHVar6->next;
        if (pHVar6 != (HashElem *)0x0) {
          if ((*(byte *)((long)pHVar6->data + 0x46) & 0x10) != 0) {
            ppVVar2 = (VTable **)((long)pHVar6->data + 0x58);
            do {
              ppVVar4 = ppVVar2;
              pVTab = *ppVVar4;
              if (pVTab == (VTable *)0x0) goto LAB_0013e15e;
              ppVVar2 = &pVTab->pNext;
            } while (pVTab->db != db);
            *ppVVar4 = pVTab->pNext;
            sqlite3VtabUnlock(pVTab);
          }
          goto LAB_0013e15e;
        }
      }
    }
    sqlite3BtreeLeaveAll(db);
    sqlite3VtabRollback(db);
    if ((forceZombie == 0) && (iVar3 = connectionIsBusy(db), iVar3 != 0)) {
      sqlite3Error(db,5,"unable to close due to unfinalized statements or unfinished backups");
      if (db->mutex == (sqlite3_mutex *)0x0) {
        return 5;
      }
      (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
      return 5;
    }
    db->magic = 0x64cffc7f;
    sqlite3LeaveMutexAndCloseZombie(db);
  }
  return 0;
}

Assistant:

static int sqlite3Close(sqlite3 *db, int forceZombie){
  if( !db ){
    return SQLITE_OK;
  }
  if( !sqlite3SafetyCheckSickOrOk(db) ){
    return SQLITE_MISUSE_BKPT;
  }
  sqlite3_mutex_enter(db->mutex);

  /* Force xDisconnect calls on all virtual tables */
  disconnectAllVtab(db);

  /* If a transaction is open, the disconnectAllVtab() call above
  ** will not have called the xDisconnect() method on any virtual
  ** tables in the db->aVTrans[] array. The following sqlite3VtabRollback()
  ** call will do so. We need to do this before the check for active
  ** SQL statements below, as the v-table implementation may be storing
  ** some prepared statements internally.
  */
  sqlite3VtabRollback(db);

  /* Legacy behavior (sqlite3_close() behavior) is to return
  ** SQLITE_BUSY if the connection can not be closed immediately.
  */
  if( !forceZombie && connectionIsBusy(db) ){
    sqlite3Error(db, SQLITE_BUSY, "unable to close due to unfinalized "
       "statements or unfinished backups");
    sqlite3_mutex_leave(db->mutex);
    return SQLITE_BUSY;
  }

#ifdef SQLITE_ENABLE_SQLLOG
  if( sqlite3GlobalConfig.xSqllog ){
    /* Closing the handle. Fourth parameter is passed the value 2. */
    sqlite3GlobalConfig.xSqllog(sqlite3GlobalConfig.pSqllogArg, db, 0, 2);
  }
#endif

  /* Convert the connection into a zombie and then close it.
  */
  db->magic = SQLITE_MAGIC_ZOMBIE;
  sqlite3LeaveMutexAndCloseZombie(db);
  return SQLITE_OK;
}